

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ThreadSafeArena::InitializeFrom
          (ThreadSafeArena *this,void *mem,size_t size)

{
  AllocationPolicy *pAVar1;
  LogMessage *pLVar2;
  LogFinisher local_aa;
  byte local_a9;
  LogMessage local_a8;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  size_t local_20;
  size_t size_local;
  void *mem_local;
  ThreadSafeArena *this_local;
  
  local_59 = 0;
  local_20 = size;
  size_local = (size_t)mem;
  mem_local = this;
  if (((ulong)mem & 7) != 0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
               ,0xda);
    local_59 = 1;
    pLVar2 = LogMessage::operator<<
                       (&local_58,"CHECK failed: (reinterpret_cast<uintptr_t>(mem) & 7) == (0u): ");
    LogFinisher::operator=(local_6d,pLVar2);
  }
  if ((local_59 & 1) != 0) {
    LogMessage::~LogMessage(&local_58);
  }
  pAVar1 = AllocPolicy(this);
  local_a9 = 0;
  if (pAVar1 != (AllocationPolicy *)0x0) {
    LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
               ,0xdb);
    local_a9 = 1;
    pLVar2 = LogMessage::operator<<(&local_a8,"CHECK failed: !AllocPolicy(): ");
    LogFinisher::operator=(&local_aa,pLVar2);
  }
  if ((local_a9 & 1) != 0) {
    LogMessage::~LogMessage(&local_a8);
  }
  Init(this);
  if ((size_local != 0) && (0x4f < local_20)) {
    TaggedAllocationPolicyPtr::set_is_user_owned_initial_block
              ((TaggedAllocationPolicyPtr *)(this + 8),true);
    SetInitialBlock(this,(void *)size_local,local_20);
  }
  return;
}

Assistant:

void ThreadSafeArena::InitializeFrom(void* mem, size_t size) {
  GOOGLE_DCHECK_EQ(reinterpret_cast<uintptr_t>(mem) & 7, 0u);
  GOOGLE_DCHECK(!AllocPolicy());  // Reset should call InitializeWithPolicy instead.
  Init();

  // Ignore initial block if it is too small.
  if (mem != nullptr && size >= kBlockHeaderSize + kSerialArenaSize) {
    alloc_policy_.set_is_user_owned_initial_block(true);
    SetInitialBlock(mem, size);
  }
}